

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O1

SHADER_TYPE __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetActiveShaderStageType
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,Uint32 StageIndex)

{
  uint uVar1;
  SHADER_TYPE SVar2;
  SHADER_TYPE SVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  uint uVar5;
  SHADER_TYPE SVar6;
  bool bVar7;
  string msg;
  string local_38;
  
  uVar1 = this->m_ShaderStages - (this->m_ShaderStages >> 1 & 0x55555555);
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
  uVar5 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f;
  uVar1 = uVar5 * 0x1010101 >> 0x18;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(ulong)uVar1;
  if (uVar1 <= StageIndex) {
    FormatString<char[26],char[40]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"StageIndex < GetNumActiveShaderStages()",(char (*) [40])(ulong)uVar5)
    ;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetActiveShaderStageType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x297);
    paVar4 = &local_38.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar4) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      paVar4 = extraout_RAX;
    }
  }
  SVar6 = this->m_ShaderStages;
  bVar7 = SVar6 == SHADER_TYPE_UNKNOWN;
  SVar3 = (SHADER_TYPE)paVar4;
  if ((!bVar7) && (SVar2 = -SVar6 & SVar6, SVar3 = SVar2, StageIndex != 0)) {
    do {
      bVar7 = SVar2 == SVar6;
      if (bVar7) break;
      SVar6 = SVar6 ^ SVar2;
      SVar2 = -SVar6 & SVar6;
      if (StageIndex == 1) {
        SVar3 = SVar2;
      }
      StageIndex = StageIndex - 1;
    } while (StageIndex != 0);
  }
  if (bVar7) {
    FormatString<char[22]>(&local_38,(char (*) [22])0x6bafda);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetActiveShaderStageType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x2a2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    SVar3 = SHADER_TYPE_UNKNOWN;
  }
  return SVar3;
}

Assistant:

SHADER_TYPE GetActiveShaderStageType(Uint32 StageIndex) const
    {
        VERIFY_EXPR(StageIndex < GetNumActiveShaderStages());

        SHADER_TYPE Stages = m_ShaderStages;
        for (Uint32 Index = 0; Stages != SHADER_TYPE_UNKNOWN; ++Index)
        {
            SHADER_TYPE StageBit = ExtractLSB(Stages);

            if (Index == StageIndex)
                return StageBit;
        }

        UNEXPECTED("Index is out of range");
        return SHADER_TYPE_UNKNOWN;
    }